

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O2

void __thiscall
QTextDocumentPrivate::setBlockFormat
          (QTextDocumentPrivate *this,QTextBlock *from,QTextBlock *to,QTextBlockFormat *newFormat,
          FormatChangeMode mode)

{
  bool bVar1;
  quint32 qVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  QObject *pQVar7;
  QTextBlockGroup *pQVar8;
  QTextBlockGroup *pQVar9;
  QTextDocumentPrivate *pQVar10;
  uint uVar11;
  long in_FS_OFFSET;
  long lStack_c0;
  int local_b0;
  undefined1 local_88 [32];
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  QTextBlock local_58;
  QTextBlock local_48;
  Data *local_38;
  
  local_38 = *(Data **)(in_FS_OFFSET + 0x28);
  beginEditBlock(this);
  if (mode == SetFormat) {
    local_b0 = QTextFormatCollection::indexForFormat(&this->formats,&newFormat->super_QTextFormat);
  }
  else {
    local_b0 = -1;
  }
  pQVar7 = &objectForFormat(this,&newFormat->super_QTextFormat)->super_QObject;
  pQVar8 = QtPrivate::qobject_cast_helper<QTextBlockGroup*,QObject>(pQVar7);
  pQVar10 = from->p;
  uVar11 = from->n;
  local_48._12_4_ = 0xaaaaaaaa;
  local_48.n = uVar11;
  local_58.p = to->p;
  local_58.n = to->n;
  local_58._12_4_ = 0xaaaaaaaa;
  local_48.p = pQVar10;
  bVar1 = QTextBlock::isValid(&local_58);
  if (bVar1) {
    QTextBlock::next((QTextBlock *)local_88);
    local_58.p = (QTextDocumentPrivate *)CONCAT44(local_88._4_4_,local_88._0_4_);
    local_58.n = local_88._8_4_;
  }
  while ((pQVar10 != local_58.p || (uVar11 != local_58.n))) {
    iVar3 = (pQVar10->blocks).data.field_0.fragments[uVar11].format;
    local_68 = 0xaaaaaaaa;
    uStack_64 = 0xaaaaaaaa;
    uStack_60 = 0xaaaaaaaa;
    uStack_5c = 0xaaaaaaaa;
    QTextFormatCollection::blockFormat((QTextFormatCollection *)&local_68,(int)&this->formats);
    pQVar7 = &objectForFormat(this,(QTextFormat *)&local_68)->super_QObject;
    pQVar9 = QtPrivate::qobject_cast_helper<QTextBlockGroup*,QObject>(pQVar7);
    if (mode == MergeFormat) {
      QTextFormat::merge((QTextFormat *)&local_68,&newFormat->super_QTextFormat);
      local_b0 = QTextFormatCollection::indexForFormat(&this->formats,(QTextFormat *)&local_68);
      pQVar7 = &objectForFormat(this,(QTextFormat *)&local_68)->super_QObject;
      pQVar8 = QtPrivate::qobject_cast_helper<QTextBlockGroup*,QObject>(pQVar7);
    }
    ((local_48.p)->blocks).data.field_0.fragments[local_48._8_8_ & 0xffffffff].format = local_b0;
    QTextBlockData::invalidate
              ((QTextBlockData *)
               ((local_48._8_8_ & 0xffffffff) * 0x48 +
               (long)((local_48.p)->blocks).data.field_0.head));
    local_88._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_88._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_88._0_2_ = 3;
    local_88[2] = 1;
    local_88[3] = '\x01';
    local_88._8_4_ = 0;
    local_88._12_4_ = 0xaaaaaaaa;
    local_88._4_4_ = iVar3;
    qVar2 = QTextBlock::position(&local_48);
    local_88._12_4_ = qVar2;
    local_88._16_4_ = 1;
    local_88._24_8_ = local_88._24_8_ & 0xffffffff00000000;
    appendUndoItem(this,(QTextUndoCommand *)local_88);
    if (pQVar8 == pQVar9) {
      lStack_c0 = 0x70;
    }
    else {
      if (pQVar9 != (QTextBlockGroup *)0x0) {
        (**(code **)(*(long *)&pQVar9->super_QTextObject + 0x68))(pQVar9,&local_48);
      }
      lStack_c0 = 0x60;
      pQVar9 = pQVar8;
    }
    if (pQVar9 != (QTextBlockGroup *)0x0) {
      (**(code **)(*(long *)&pQVar8->super_QTextObject + lStack_c0))(pQVar8,&local_48);
    }
    QTextFormat::~QTextFormat((QTextFormat *)&local_68);
    QTextBlock::next((QTextBlock *)local_88);
    pQVar10 = (QTextDocumentPrivate *)CONCAT44(local_88._4_4_,local_88._0_4_);
    local_48.n = local_88._8_4_;
    uVar11 = local_88._8_4_;
    local_48.p = pQVar10;
  }
  iVar3 = QTextBlock::position(from);
  iVar4 = QTextBlock::position(to);
  iVar5 = QTextBlock::length(to);
  iVar6 = QTextBlock::position(from);
  documentChange(this,iVar3,(iVar4 + iVar5) - iVar6);
  endEditBlock(this);
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocumentPrivate::setBlockFormat(const QTextBlock &from, const QTextBlock &to,
                                          const QTextBlockFormat &newFormat, FormatChangeMode mode)
{
    beginEditBlock();

    Q_ASSERT(mode != SetFormatAndPreserveObjectIndices); // only implemented for setCharFormat

    Q_ASSERT(newFormat.isValid());

    int newFormatIdx = -1;
    if (mode == SetFormat)
        newFormatIdx = formats.indexForFormat(newFormat);
    QTextBlockGroup *group = qobject_cast<QTextBlockGroup *>(objectForFormat(newFormat));

    QTextBlock it = from;
    QTextBlock end = to;
    if (end.isValid())
        end = end.next();

    for (; it != end; it = it.next()) {
        int oldFormat = block(it)->format;
        QTextBlockFormat format = formats.blockFormat(oldFormat);
        QTextBlockGroup *oldGroup = qobject_cast<QTextBlockGroup *>(objectForFormat(format));
        if (mode == MergeFormat) {
            format.merge(newFormat);
            newFormatIdx = formats.indexForFormat(format);
            group = qobject_cast<QTextBlockGroup *>(objectForFormat(format));
        }
        block(it)->format = newFormatIdx;

        block(it)->invalidate();

        QT_INIT_TEXTUNDOCOMMAND(c, QTextUndoCommand::BlockFormatChanged, true, QTextUndoCommand::MoveCursor, oldFormat,
                                0, it.position(), 1, 0);
        appendUndoItem(c);

        if (group != oldGroup) {
            if (oldGroup)
                oldGroup->blockRemoved(it);
            if (group)
                group->blockInserted(it);
        } else if (group) {
            group->blockFormatChanged(it);
        }
    }

    documentChange(from.position(), to.position() + to.length() - from.position());

    endEditBlock();
}